

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O0

const_iterator * __thiscall
compressed_sparse_matrix<filtration_entry_t>::cend
          (const_iterator *__return_storage_ptr__,compressed_sparse_matrix<filtration_entry_t> *this
          ,size_t index)

{
  size_t sVar1;
  const_reference pvVar2;
  const_iterator local_40;
  size_t local_20;
  size_t index_local;
  compressed_sparse_matrix<filtration_entry_t> *this_local;
  
  local_20 = index;
  index_local = (size_t)this;
  this_local = (compressed_sparse_matrix<filtration_entry_t> *)__return_storage_ptr__;
  sVar1 = size(this);
  if (index < sVar1) {
    std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>::cbegin
              (&local_40,&this->entries);
    pvVar2 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->bounds,local_20);
    std::operator+(__return_storage_ptr__,&local_40,*pvVar2);
    return __return_storage_ptr__;
  }
  __assert_fail("index < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JasonPSmith[P]tournser/pytournser/../tournser.cpp"
                ,0xaf,
                "typename std::deque<ValueType>::const_iterator compressed_sparse_matrix<filtration_entry_t>::cend(size_t) const [ValueType = filtration_entry_t]"
               );
}

Assistant:

typename std::deque<ValueType>::const_iterator cend(size_t index) const {
		assert(index < size());
		return entries.cbegin() + bounds[index];
	}